

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O3

void __thiscall iDynTree::GyroscopeSensor::~GyroscopeSensor(GyroscopeSensor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GyroscopePrivateAttributes *pGVar2;
  pointer pcVar3;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)&PTR__GyroscopeSensor_00185a10;
  pGVar2 = this->pimpl;
  if (pGVar2 != (GyroscopePrivateAttributes *)0x0) {
    pcVar3 = (pGVar2->parent_link_name)._M_dataplus._M_p;
    paVar1 = &(pGVar2->parent_link_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pGVar2->name)._M_dataplus._M_p;
    paVar1 = &(pGVar2->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pGVar2,0xa8);
  LinkSensor::~LinkSensor(&this->super_LinkSensor);
  return;
}

Assistant:

GyroscopeSensor::~GyroscopeSensor()
{
    delete this->pimpl;
}